

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::computeOutput(Model *this,Vector *hidden,Vector *output)

{
  element_type *peVar1;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  Vector *in_RSI;
  QMatrix *in_RDI;
  Vector *unaff_retaddr;
  __shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffd0;
  
  if (((in_RDI[3].qnorm_ & 1U) != 0) &&
     (peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17a124), (peVar1->qout & 1U) != 0)) {
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (in_stack_ffffffffffffffd0);
    Vector::mul(unaff_retaddr,in_RDI,in_RSI);
    return;
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_RDX);
  Vector::mul(unaff_retaddr,(Matrix *)in_RDI,in_RSI);
  return;
}

Assistant:

void Model::computeOutput(Vector& hidden, Vector& output) const {
	if (quant_ && args_->qout) {
		output.mul(*qwo_, hidden);
	} else {
		output.mul(*wo_, hidden);
	}
}